

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::RandomBufferWriteCase::iterate(RandomBufferWriteCase *this)

{
  uint uVar1;
  GLenum usage;
  TestLog *pTVar2;
  deUint8 *ptr;
  pointer pVVar3;
  pointer pVVar4;
  vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *pvVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  TestError *this_00;
  int iVar9;
  size_t in_RCX;
  pointer puVar10;
  pointer pVVar11;
  void *__buf;
  int numBytes;
  ReferenceBuffer *this_01;
  long offset;
  uint numBytes_00;
  int iVar12;
  bool bVar13;
  float fVar14;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  CallLogWrapper *local_1d8;
  ReferenceBuffer *local_1d0;
  int numIterations;
  vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *local_1c0;
  ulong local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  RandomBufferWriteCase *local_190;
  int local_188;
  int local_184;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  LogSection local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Random rnd;
  
  numIterations = 5;
  uVar1 = this->m_seed;
  dVar6 = ::deInt32Hash(this->m_iterNdx);
  deRandom_init(&rnd.m_rnd,uVar1 ^ dVar6 ^ 0xacf92e);
  pTVar2 = ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Iteration",&local_1d9);
  local_184 = this->m_iterNdx + 1;
  de::toString<int>(&local_100,&local_184);
  std::operator+(&local_1b0,&local_180,&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Iteration ",&local_1da);
  local_188 = this->m_iterNdx + 1;
  de::toString<int>(&local_c0,&local_188);
  std::operator+(&local_80,&local_a0,&local_c0);
  std::operator+(&local_60,&local_80," / ");
  de::toString<int>(&local_e0,&numIterations);
  std::operator+(&local_120,&local_60,&local_e0);
  tcu::LogSection::LogSection(&local_160,&local_1b0,&local_120);
  tcu::LogSection::write(&local_160,(int)pTVar2,__buf,in_RCX);
  tcu::LogSection::~LogSection(&local_160);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_180);
  local_1d8 = &(this->super_BufferCase).super_CallLogWrapper;
  local_1d0 = &this->m_refBuffer;
  local_1c0 = (vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&this->m_validRanges;
  local_1b8 = 0;
  iVar12 = 7;
  this_01 = local_1d0;
  local_190 = this;
  while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    uVar1 = iterate::bufferTargets[dVar6 & 7];
    if (this->m_curSize == 0) {
      bVar13 = true;
    }
    else {
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      bVar13 = fVar14 < 0.07;
    }
    if (uVar1 != (uint)local_1b8) {
      glu::CallLogWrapper::glBindBuffer(local_1d8,uVar1,this->m_buffer);
      local_1b8 = (ulong)uVar1;
    }
    if (bVar13) {
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      numBytes_00 = dVar6 % 0x7ff5 + 0xc;
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      usage = iterate::usageHints[(ulong)dVar6 % 9];
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(this_01,numBytes_00);
      if (0.2 <= fVar14) {
        puVar10 = (pointer)0x0;
      }
      else {
        ptr = (local_1d0->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        this_01 = local_1d0;
        deqp::gls::BufferTestUtil::fillWithRandomBytes(ptr,numBytes_00,dVar6);
        puVar10 = (this_01->m_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      glu::CallLogWrapper::glBufferData(local_1d8,uVar1,(ulong)numBytes_00,puVar10,usage);
      this = local_190;
      pVVar3 = (local_190->m_validRanges).
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((local_190->m_validRanges).
          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
          super__Vector_impl_data._M_finish != pVVar3) {
        (local_190->m_validRanges).
        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar3;
      }
      if (fVar14 < 0.2) {
        local_160.m_name._M_dataplus._M_p._0_4_ = 0;
        local_160.m_name._M_dataplus._M_p._4_4_ = numBytes_00;
        std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
        emplace_back<tcu::Vector<int,2>>(local_1c0,(Vector<int,_2> *)&local_160);
      }
      this->m_curSize = numBytes_00;
    }
    else {
      iVar8 = this->m_curSize;
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      fVar14 = powf(fVar14 * 0.7 + 0.0,3.0);
      fVar14 = fVar14 * (float)iVar8;
      iVar7 = (int)(fVar14 + *(float *)(&DAT_017c9790 + (ulong)(fVar14 < 0.0) * 4));
      iVar8 = this->m_curSize;
      iVar9 = iVar7;
      if (iVar8 <= iVar7) {
        iVar9 = iVar8;
      }
      numBytes = 0xc;
      if (0xb < iVar7) {
        numBytes = iVar9;
      }
      iVar8 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar8 - numBytes);
      offset = (long)iVar8;
      puVar10 = (this->m_refBuffer).m_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      deqp::gls::BufferTestUtil::fillWithRandomBytes(puVar10 + offset,numBytes,dVar6);
      glu::CallLogWrapper::glBufferSubData
                (local_1d8,uVar1,offset,(long)numBytes,
                 (this->m_refBuffer).m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + offset);
      pvVar5 = local_1c0;
      local_1b0._M_dataplus._M_p._0_4_ = iVar8;
      local_1b0._M_dataplus._M_p._4_4_ = numBytes;
      addRangeToList((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                     &local_160,
                     (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_1c0
                     ,(IVec2 *)&local_1b0);
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::_M_move_assign
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)pvVar5);
      std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
                ((_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                 &local_160);
      this_01 = local_1d0;
    }
  }
  local_100._M_string_length._0_4_ = glu::CallLogWrapper::glGetError(local_1d8);
  if ((GLenum)local_100._M_string_length != 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Got ",(allocator<char> *)&local_120);
    local_100._M_dataplus._M_p = (pointer)glu::getErrorName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_180,&local_100);
    std::operator+(&local_160.m_name,&local_1b0,&local_180);
    tcu::TestError::TestError(this_00,&local_160.m_name);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pVVar3 = (this->m_validRanges).
           super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pVVar11 = pVVar3;
    pVVar4 = (this->m_validRanges).
             super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar11 == pVVar4) goto LAB_0110cf14;
    iVar12 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                       (this->m_verifier,(EVP_PKEY_CTX *)(ulong)this->m_buffer,
                        (this->m_refBuffer).m_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)(uint)pVVar11->m_data[0],
                        (uchar *)(ulong)(uint)pVVar11->m_data[1],0x8892);
    pVVar3 = pVVar11 + 1;
  } while ((char)iVar12 != '\0');
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Buffer verification failed");
LAB_0110cf14:
  tcu::TestLog::endSection
            (((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  iVar12 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar12;
  return (IterateResult)(iVar12 < 5 && pVVar11 == pVVar4);
}

Assistant:

IterateResult iterate (void)
	{
		// Parameters.
		const int	numIterations				= 5;
		const int	uploadsPerIteration			= 7;
		const int	minSize						= 12;
		const int	maxSize						= 32*1024;
		const float	respecifyProbability		= 0.07f;
		const float	respecifyDataProbability	= 0.2f;

		static const deUint32 bufferTargets[] =
		{
			GL_ARRAY_BUFFER,
			GL_COPY_READ_BUFFER,
			GL_COPY_WRITE_BUFFER,
			GL_ELEMENT_ARRAY_BUFFER,
			GL_PIXEL_PACK_BUFFER,
			GL_PIXEL_UNPACK_BUFFER,
			GL_TRANSFORM_FEEDBACK_BUFFER,
			GL_UNIFORM_BUFFER
		};

		static const deUint32 usageHints[] =
		{
			GL_STREAM_DRAW,
			GL_STREAM_READ,
			GL_STREAM_COPY,
			GL_STATIC_DRAW,
			GL_STATIC_READ,
			GL_STATIC_COPY,
			GL_DYNAMIC_DRAW,
			GL_DYNAMIC_READ,
			GL_DYNAMIC_COPY
		};

		bool		iterOk					= true;
		deUint32	curBoundTarget			= GL_NONE;
		de::Random	rnd						(m_seed ^ deInt32Hash(m_iterNdx) ^ 0xacf92e);

		m_testCtx.getLog() << TestLog::Section(string("Iteration") + de::toString(m_iterNdx+1), string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(numIterations));

		for (int uploadNdx = 0; uploadNdx < uploadsPerIteration; uploadNdx++)
		{
			const deUint32	target		= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
			const bool		respecify	= m_curSize == 0 || rnd.getFloat() < respecifyProbability;

			if (target != curBoundTarget)
			{
				glBindBuffer(target, m_buffer);
				curBoundTarget = target;
			}

			if (respecify)
			{
				const int		size			= rnd.getInt(minSize, maxSize);
				const deUint32	hint			= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
				const bool		fillWithData	= rnd.getFloat() < respecifyDataProbability;

				m_refBuffer.setSize(size);
				if (fillWithData)
					fillWithRandomBytes(m_refBuffer.getPtr(), size, rnd.getUint32());

				glBufferData(target, size, fillWithData ? m_refBuffer.getPtr() : DE_NULL, hint);

				m_validRanges.clear();
				if (fillWithData)
					m_validRanges.push_back(tcu::IVec2(0, size));

				m_curSize = size;
			}
			else
			{
				// \note Non-uniform size distribution.
				const int	size	= de::clamp(deRoundFloatToInt32((float)m_curSize * deFloatPow(rnd.getFloat(0.0f, 0.7f), 3.0f)), minSize, m_curSize);
				const int	offset	= rnd.getInt(0, m_curSize-size);

				fillWithRandomBytes(m_refBuffer.getPtr()+offset, size, rnd.getUint32());
				glBufferSubData(target, offset, size, m_refBuffer.getPtr()+offset);

				m_validRanges = addRangeToList(m_validRanges, tcu::IVec2(offset, size));
			}
		}

		// Check error.
		{
			deUint32 err = glGetError();
			if (err != GL_NO_ERROR)
				throw tcu::TestError(string("Got ") + glu::getErrorStr(err).toString());
		}

		// Verify valid ranges.
		for (vector<IVec2>::const_iterator range = m_validRanges.begin(); range != m_validRanges.end(); range++)
		{
			const deUint32 targetHint = GL_ARRAY_BUFFER;
			if (!m_verifier->verify(m_buffer, m_refBuffer.getPtr(), range->x(), range->y(), targetHint))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer verification failed");
				iterOk = false;
				break;
			}
		}

		m_testCtx.getLog() << TestLog::EndSection;

		DE_ASSERT(iterOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);

		m_iterNdx += 1;
		return (iterOk && m_iterNdx < numIterations) ? CONTINUE : STOP;
	}